

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test::TestBody
          (SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test *this)

{
  PileId *this_00;
  TableauPileMock *this_01;
  bool bVar1;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_02;
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_03;
  char *message;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  AssertHelper local_108;
  Message local_100;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_f8;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_e0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_b0;
  ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  local_98;
  Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  local_88;
  WithoutMatchers local_61;
  Matcher<unsigned_int> local_60;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  local_48;
  InSequence local_11;
  SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test *pSStack_10;
  InSequence seq;
  SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test *this_local;
  
  pSStack_10 = this;
  testing::InSequence::InSequence(&local_11);
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::TableauPileMock>
            (&this->super_SolitaireEmptyHandTest,
             (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock,
             &(this->super_SolitaireEmptyHandTest).snapshotMock);
  this_01 = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock;
  testing::Matcher<unsigned_int>::Matcher(&local_60,2);
  piles::TableauPileMock::gmock_tryPullOutCards(&local_48,this_01,&local_60);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::operator()(&local_48,&local_61,(void *)0x0);
  this_03 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x138,"lastTableauPileMock","tryPullOutCards(quantityToPullOut)");
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_b0,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  testing::Return<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            ((testing *)&local_98,&local_b0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_88,(ReturnAction *)&local_98);
  testing::internal::
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::WillOnce(this_03,&local_88);
  testing::
  Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::~Action(&local_88);
  testing::internal::
  ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>::
  ~ReturnAction(&local_98);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector(&local_b0);
  testing::internal::
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::~MockSpec(&local_48);
  testing::Matcher<unsigned_int>::~Matcher(&local_60);
  SolitaireEmptyHandTest::expectSavingSourcePileSnapshot
            (&this->super_SolitaireEmptyHandTest,&(this->super_SolitaireEmptyHandTest).snapshotMock)
  ;
  this_00 = (PileId *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  piles::PileId::PileId(this_00,(PileId *)&(anonymous_namespace)::lastTableauPileId);
  Solitaire::tryPullOutCardsFromTableauPile
            (&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire,this_00,2);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_f8,(testing *)(anonymous_namespace)::twoCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_e0,(internal *)&local_f8,matcher);
  Solitaire::getCardsInHand(&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_c8,(char *)&local_e0,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_e0);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x13d,message);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  testing::InSequence::~InSequence(&local_11);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutCardsFromTableauPile) {
    InSequence seq;
    expectSnapshotCreation(lastTableauPileMock, snapshotMock);
    EXPECT_CALL(lastTableauPileMock, tryPullOutCards(quantityToPullOut))
        .WillOnce(Return(twoCards));
    expectSavingSourcePileSnapshot(snapshotMock);

    solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(twoCards));
}